

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::Poison(CrcCordState *this)

{
  bool bVar1;
  uint32_t uVar2;
  Rep *pRVar3;
  size_t sVar4;
  crc32c_t local_78;
  int local_74;
  crc32c_t local_70;
  uint local_6c;
  reference pPStack_68;
  uint32_t crc;
  PrefixCrc *prefix_crc;
  iterator __end3;
  iterator __begin3;
  deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  *__range3;
  Rep *rep;
  CrcCordState *this_local;
  
  pRVar3 = mutable_rep(this);
  sVar4 = NumChunks(this);
  if (sVar4 == 0) {
    local_74 = 0;
    crc32c_t::crc32c_t(&local_78,1);
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
    ::emplace_back<int,absl::lts_20250127::crc32c_t>
              ((deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
                *)&pRVar3->prefix_crc,&local_74,&local_78);
  }
  else {
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ::begin((iterator *)&__end3._M_node,&pRVar3->prefix_crc);
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ::end((iterator *)&prefix_crc,&pRVar3->prefix_crc);
    while (bVar1 = std::operator!=((_Self *)&__end3._M_node,(_Self *)&prefix_crc), bVar1) {
      pPStack_68 = std::
                   _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                   ::operator*((_Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                                *)&__end3._M_node);
      uVar2 = crc32c_t::operator_cast_to_unsigned_int(&pPStack_68->crc);
      local_6c = uVar2 + 0x2e76e41b;
      local_6c = rotr<unsigned_int>(local_6c,0x11);
      crc32c_t::crc32c_t(&local_70,local_6c);
      (pPStack_68->crc).crc_ = local_70.crc_;
      std::
      _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
      ::operator++((_Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                    *)&__end3._M_node);
    }
  }
  return;
}

Assistant:

void CrcCordState::Poison() {
  Rep* rep = mutable_rep();
  if (NumChunks() > 0) {
    for (auto& prefix_crc : rep->prefix_crc) {
      // This is basically CRC32::Scramble().
      uint32_t crc = static_cast<uint32_t>(prefix_crc.crc);
      crc += 0x2e76e41b;
      crc = absl::rotr(crc, 17);
      prefix_crc.crc = crc32c_t{crc};
    }
  } else {
    // Add a fake corrupt chunk.
    rep->prefix_crc.emplace_back(0, crc32c_t{1});
  }
}